

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

wchar_t translateCursorShape(wchar_t shape)

{
  wchar_t local_c;
  wchar_t shape_local;
  
  switch(shape) {
  case L'\x00036001':
    local_c = L'\x02';
    break;
  case L'\x00036002':
    local_c = L'\x98';
    break;
  case L'\x00036003':
    local_c = L'\"';
    break;
  case L'\x00036004':
    local_c = L':';
    break;
  case L'\x00036005':
    local_c = L'l';
    break;
  case L'\x00036006':
    local_c = L't';
    break;
  default:
    local_c = L'\0';
  }
  return local_c;
}

Assistant:

static int translateCursorShape(int shape)
{
    switch (shape)
    {
        case GLFW_ARROW_CURSOR:
            return XC_arrow;
        case GLFW_IBEAM_CURSOR:
            return XC_xterm;
        case GLFW_CROSSHAIR_CURSOR:
            return XC_crosshair;
        case GLFW_HAND_CURSOR:
            return XC_hand1;
        case GLFW_HRESIZE_CURSOR:
            return XC_sb_h_double_arrow;
        case GLFW_VRESIZE_CURSOR:
            return XC_sb_v_double_arrow;
    }

    return 0;
}